

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_windows.cpp
# Opt level: O0

bool __thiscall Screen_Manager::Pending(Screen_Manager *this,XEvent *event_return)

{
  int iVar1;
  Screen_Info *local_28;
  Screen_Info *screen;
  XEvent *event_return_local;
  Screen_Manager *this_local;
  
  local_28 = this->head;
  do {
    iVar1 = XPending(local_28->dpy);
    if (iVar1 != 0) {
      if (event_return != (XEvent *)0x0) {
        XNextEvent(local_28->dpy,event_return);
        this->head = local_28->next;
      }
      return true;
    }
    local_28 = local_28->next;
  } while (local_28 != this->head);
  return false;
}

Assistant:

bool
Screen_Manager::Pending(XEvent *event_return)
{
  Screen_Info *screen = head;
  do {
    if (XPending(screen->dpy)) {
      if (event_return) {
        XNextEvent(screen->dpy, event_return);
        head = screen->next;
      }
      return true;
    }
    screen = screen->next;
  } while (screen != head);

  return false;
}